

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemastypes.c
# Opt level: O0

xmlSchemaValPtr xmlSchemaDateNormalize(xmlSchemaValPtr dt,double offset)

{
  xmlSchemaValPtr dur_00;
  xmlSchemaValPtr ret;
  xmlSchemaValPtr dur;
  double offset_local;
  xmlSchemaValPtr dt_local;
  
  if (dt == (xmlSchemaValPtr)0x0) {
    dt_local = (xmlSchemaValPtr)0x0;
  }
  else if ((((dt->type == XML_SCHEMAS_TIME) || (dt->type == XML_SCHEMAS_DATETIME)) ||
           (dt->type == XML_SCHEMAS_DATE)) &&
          ((short)(*(short *)((long)&dt->value + 0x18) << 3) >> 4 != 0)) {
    dur_00 = xmlSchemaNewValue(XML_SCHEMAS_DURATION);
    if (dur_00 == (xmlSchemaValPtr)0x0) {
      dt_local = (xmlSchemaValPtr)0x0;
    }
    else {
      (dur_00->value).date.sec = (dur_00->value).date.sec - offset;
      dt_local = _xmlSchemaDateAdd(dt,dur_00);
      if (dt_local == (xmlSchemaValPtr)0x0) {
        dt_local = (xmlSchemaValPtr)0x0;
      }
      else {
        xmlSchemaFreeValue(dur_00);
      }
    }
  }
  else {
    dt_local = xmlSchemaDupVal(dt);
  }
  return dt_local;
}

Assistant:

static xmlSchemaValPtr
xmlSchemaDateNormalize (xmlSchemaValPtr dt, double offset)
{
    xmlSchemaValPtr dur, ret;

    if (dt == NULL)
        return NULL;

    if (((dt->type != XML_SCHEMAS_TIME) &&
         (dt->type != XML_SCHEMAS_DATETIME) &&
	 (dt->type != XML_SCHEMAS_DATE)) || (dt->value.date.tzo == 0))
        return xmlSchemaDupVal(dt);

    dur = xmlSchemaNewValue(XML_SCHEMAS_DURATION);
    if (dur == NULL)
        return NULL;

    dur->value.date.sec -= offset;

    ret = _xmlSchemaDateAdd(dt, dur);
    if (ret == NULL)
        return NULL;

    xmlSchemaFreeValue(dur);

    /* ret->value.date.tzo = 0; */
    return ret;
}